

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O0

void __thiscall KMeans::modelToQueries(KMeans *this)

{
  bool bVar1;
  void *pvVar2;
  Query *pQVar3;
  element_type *peVar4;
  vector<Aggregate_*,_std::allocator<Aggregate_*>_> *this_00;
  long in_RDI;
  Query *query_1;
  Aggregate *agg_1;
  size_t var;
  Query *query;
  Aggregate *agg;
  Query *in_stack_fffffffffffffd98;
  QueryCompiler *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  byte in_stack_fffffffffffffdaf;
  vector<Aggregate_*,_std::allocator<Aggregate_*>_> *in_stack_fffffffffffffdb0;
  pair<unsigned_long,_Query_*> local_200;
  pair<unsigned_long,_Query_*> local_1f0;
  reference local_1e0;
  Query *local_1d0 [25];
  vector<Aggregate_*,_std::allocator<Aggregate_*>_> *local_108;
  reference local_100;
  unsigned_long local_f0;
  Query *local_e8;
  void *local_10;
  
  pvVar2 = operator_new(0x30);
  Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffda0);
  local_10 = pvVar2;
  std::bitset<1500UL>::bitset((bitset<1500UL> *)0x258174);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
  pQVar3 = (Query *)operator_new(0x30);
  Query::Query((Query *)in_stack_fffffffffffffda0);
  local_e8 = pQVar3;
  std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
            (in_stack_fffffffffffffdb0,
             (value_type *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
  peVar4 = std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2581d6);
  local_e8->_rootID = peVar4->_root->_id;
  (local_e8->_fVars).super__Base_bitset<2UL>._M_w[0] = *(_WordT *)(in_RDI + 0xc0);
  (local_e8->_fVars).super__Base_bitset<2UL>._M_w[1] = *(_WordT *)(in_RDI + 200);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x258217);
  QueryCompiler::addQuery(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  countQuery = local_e8;
  for (local_f0 = 0; local_f0 < 100; local_f0 = local_f0 + 1) {
    std::bitset<100UL>::operator[]
              ((bitset<100UL> *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
               (size_t)in_stack_fffffffffffffda0);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffda0);
    std::bitset<100UL>::reference::~reference(&local_100);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_00 = (vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)operator_new(0x30);
      Aggregate::Aggregate((Aggregate *)in_stack_fffffffffffffda0);
      local_108 = this_00;
      std::bitset<1500UL>::bitset((bitset<1500UL> *)0x25832c);
      std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                 in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
      pQVar3 = (Query *)operator_new(0x30);
      Query::Query((Query *)in_stack_fffffffffffffda0);
      local_1d0[0] = pQVar3;
      std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
                (this_00,(value_type *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8)
                );
      local_1d0[0]->_rootID = *(size_t *)(*(long *)(in_RDI + 0xb8) + local_f0 * 8);
      std::bitset<100UL>::set
                ((bitset<100UL> *)this_00,
                 CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                 SUB81((ulong)in_stack_fffffffffffffda0 >> 0x38,0));
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2583cf);
      QueryCompiler::addQuery(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                 (size_t)in_stack_fffffffffffffda0);
      in_stack_fffffffffffffdaf =
           std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffda0);
      std::bitset<100UL>::reference::~reference(&local_1e0);
      if ((in_stack_fffffffffffffdaf & 1) == 0) {
        in_stack_fffffffffffffd98 = (Query *)(in_RDI + 0xe8);
        std::pair<unsigned_long,_Query_*>::pair<unsigned_long_&,_Query_*&,_true>
                  (&local_200,&local_f0,local_1d0);
        std::
        vector<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
        ::push_back((vector<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
                     *)in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
      }
      else {
        in_stack_fffffffffffffda0 = (QueryCompiler *)(in_RDI + 0xd0);
        std::pair<unsigned_long,_Query_*>::pair<unsigned_long_&,_Query_*&,_true>
                  (&local_1f0,&local_f0,local_1d0);
        std::
        vector<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
        ::push_back((vector<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
                     *)in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
      }
      *(Query **)(in_RDI + 0x100 + local_f0 * 8) = local_1d0[0];
    }
  }
  return;
}

Assistant:

void KMeans::modelToQueries()
{
    // Count aggregate
    Aggregate* agg = new Aggregate();
    agg->_agg.push_back(prod_bitset());

    // Create count query
    Query* query = new Query();
    query->_aggregates.push_back(agg);
    query->_rootID = _td->_root->_id;
    query->_fVars = clusterVariables;

    _compiler->addQuery(query);        
    countQuery = query;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var) 
    {
        if (!_isFeature[var])
            continue;

        // Categorical variable
        Aggregate* agg = new Aggregate();
        agg->_agg.push_back(prod_bitset());

        // Create a query & Aggregate
        Query* query = new Query();
        query->_aggregates.push_back(agg);
        query->_rootID = _queryRootIndex[var];
        query->_fVars.set(var);

        _compiler->addQuery(query);
        
        if (_isCategoricalFeature[var])
        {
            // Categorical variable
            categoricalQueries.push_back({var,query});
        }
        else
        {
            // Continuous variable
            continuousQueries.push_back({var,query});
        }

        varToQuery[var] = query;
    }
}